

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O2

int Map_MappingCountAllCuts(Map_Man_t *pMan)

{
  Map_Node_t *pMVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  Map_Node_t **ppMVar5;
  Map_Cut_t *pMVar6;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)pMan->nBins;
  if (pMan->nBins < 1) {
    uVar3 = uVar4;
  }
  iVar2 = 0;
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    ppMVar5 = pMan->pBins + uVar4;
    while (pMVar1 = *ppMVar5, pMVar1 != (Map_Node_t *)0x0) {
      pMVar6 = (Map_Cut_t *)&pMVar1->pCuts;
      while (pMVar6 = pMVar6->pNext, pMVar6 != (Map_Cut_t *)0x0) {
        iVar2 = iVar2 + (uint)('\x01' < pMVar6->nLeaves);
      }
      ppMVar5 = &pMVar1->pNext;
    }
  }
  return iVar2;
}

Assistant:

int Map_MappingCountAllCuts( Map_Man_t * pMan )
{
    Map_Node_t * pNode;
    Map_Cut_t * pCut;
    int i, nCuts;
//    int nCuts55 = 0, nCuts5x = 0, nCuts4x = 0, nCuts3x = 0;
//    int pCounts[7] = {0};
    nCuts = 0;
    for ( i = 0; i < pMan->nBins; i++ )
        for ( pNode = pMan->pBins[i]; pNode; pNode = pNode->pNext )
            for ( pCut = pNode->pCuts; pCut; pCut = pCut->pNext )
                if ( pCut->nLeaves > 1 ) // skip the elementary cuts
                {
                    nCuts++;
/*
                    if ( Map_CutRegular(pCut->pOne)->nLeaves == 5 && Map_CutRegular(pCut->pTwo)->nLeaves == 5 )
                        nCuts55++;
                    if ( Map_CutRegular(pCut->pOne)->nLeaves == 5 || Map_CutRegular(pCut->pTwo)->nLeaves == 5 )
                        nCuts5x++;
                    else if ( Map_CutRegular(pCut->pOne)->nLeaves == 4 || Map_CutRegular(pCut->pTwo)->nLeaves == 4 )
                        nCuts4x++;
                    else if ( Map_CutRegular(pCut->pOne)->nLeaves == 3 || Map_CutRegular(pCut->pTwo)->nLeaves == 3 )
                        nCuts3x++;
*/                  
//                    pCounts[ Map_CutRegular(pCut->pOne)->nLeaves ]++;
//                    pCounts[ Map_CutRegular(pCut->pTwo)->nLeaves ]++;
                }
//    printf( "Total cuts = %6d. 55 = %6d. 5x = %6d. 4x = %6d. 3x = %6d.\n", nCuts, nCuts55, nCuts5x, nCuts4x, nCuts3x );

//    printf( "Total cuts = %6d. 6= %6d. 5= %6d. 4= %6d. 3= %6d. 2= %6d. 1= %6d.\n", 
//        nCuts, pCounts[6], pCounts[5], pCounts[4], pCounts[3], pCounts[2], pCounts[1] );
    return nCuts;
}